

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

void __thiscall
create::Create::Create(Create *this,string *dev,int *baud,RobotModel m,bool install_signal_handler)

{
  sockaddr *__addr;
  int *piVar1;
  element_type *this_00;
  function<void_()> local_58;
  byte local_21;
  sockaddr *psStack_20;
  bool install_signal_handler_local;
  int *baud_local;
  string *dev_local;
  Create *this_local;
  
  (this->model).maxVelocity = m.maxVelocity;
  (this->model).wheelDiameter = m.wheelDiameter;
  (this->model).id = m.id;
  (this->model).version = m.version;
  (this->model).axleLength = m.axleLength;
  (this->model).baud = m.baud;
  local_21 = install_signal_handler;
  psStack_20 = (sockaddr *)baud;
  baud_local = (int *)dev;
  dev_local = (string *)this;
  Pose::Pose(&this->pose);
  Pose::Pose(&this->vel);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->prevOnDataTime);
  std::deque<float,_std::allocator<float>_>::deque(&this->dtHistory);
  boost::numeric::ublas::
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  ::matrix(&this->poseCovar);
  std::shared_ptr<create::Data>::shared_ptr(&this->data);
  std::shared_ptr<create::Serial>::shared_ptr(&this->serial);
  init(this,(EVP_PKEY_CTX *)(ulong)(local_21 & 1));
  this_00 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->serial);
  piVar1 = baud_local;
  __addr = psStack_20;
  std::function<void_()>::function(&local_58,(nullptr_t)0x0);
  Serial::connect(this_00,(int)piVar1,__addr,(socklen_t)&local_58);
  std::function<void_()>::~function(&local_58);
  return;
}

Assistant:

Create::Create(const std::string& dev, const int& baud, RobotModel m, bool install_signal_handler)
    : model(m)
  {
    init(install_signal_handler);
    serial->connect(dev, baud);
  }